

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_root.c
# Opt level: O1

int arkRootCheck3(void *arkode_mem)

{
  double dVar1;
  undefined8 *puVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  
  if (arkode_mem == (void *)0x0) {
    iVar6 = -0x15;
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode","arkRootCheck3","arkode_mem = NULL illegal.");
  }
  else {
    puVar2 = *(undefined8 **)((long)arkode_mem + 0x280);
    if (*(int *)(puVar2 + 0xc) == 2) {
      puVar2[5] = *(undefined8 *)((long)arkode_mem + 0x198);
      N_VScale(1.0,*(N_Vector *)((long)arkode_mem + 0x110),*(N_Vector *)((long)arkode_mem + 0x108));
    }
    if (*(int *)(puVar2 + 0xc) == 1) {
      dVar1 = (double)puVar2[10];
      if (0.0 <= (dVar1 - *(double *)((long)arkode_mem + 0x198)) *
                 *(double *)((long)arkode_mem + 0x168)) {
        puVar2[5] = *(double *)((long)arkode_mem + 0x198);
        N_VScale(1.0,*(N_Vector *)((long)arkode_mem + 0x110),*(N_Vector *)((long)arkode_mem + 0x108)
                );
      }
      else {
        puVar2[5] = dVar1;
        arkGetDky((ARKodeMem)arkode_mem,dVar1,0,*(N_Vector *)((long)arkode_mem + 0x108));
      }
    }
    iVar4 = (*(code *)*puVar2)(puVar2[5],*(undefined8 *)((long)arkode_mem + 0x108),puVar2[8],
                               puVar2[0x10]);
    puVar2[0xd] = puVar2[0xd] + 1;
    iVar6 = -0xc;
    if (iVar4 == 0) {
      puVar2[0xb] = (ABS(*(double *)((long)arkode_mem + 0x168)) +
                    ABS(*(double *)((long)arkode_mem + 0x198))) * *(double *)((long)arkode_mem + 8)
                    * 100.0;
      iVar4 = arkRootfind(arkode_mem);
      if (iVar4 != -0xc) {
        uVar7 = (ulong)*(uint *)(puVar2 + 1);
        if (0 < (int)*(uint *)(puVar2 + 1)) {
          lVar3 = puVar2[0xe];
          lVar5 = 0;
          do {
            if ((*(int *)(lVar3 + lVar5 * 4) == 0) &&
               ((dVar1 = *(double *)(puVar2[9] + lVar5 * 8), dVar1 != 0.0 || (NAN(dVar1))))) {
              *(undefined4 *)(lVar3 + lVar5 * 4) = 1;
            }
            lVar5 = lVar5 + 1;
            uVar7 = (ulong)*(int *)(puVar2 + 1);
          } while (lVar5 < (long)uVar7);
        }
        puVar2[4] = puVar2[6];
        if (0 < (int)uVar7) {
          lVar3 = puVar2[7];
          lVar5 = puVar2[9];
          uVar8 = 0;
          do {
            *(undefined8 *)(lVar3 + uVar8 * 8) = *(undefined8 *)(lVar5 + uVar8 * 8);
            uVar8 = uVar8 + 1;
          } while ((uVar7 & 0xffffffff) != uVar8);
        }
        if (iVar4 == 0) {
          iVar6 = 0;
        }
        else {
          arkGetDky((ARKodeMem)arkode_mem,(realtype)puVar2[6],0,
                    *(N_Vector *)((long)arkode_mem + 0x108));
          iVar6 = 1;
        }
      }
    }
  }
  return iVar6;
}

Assistant:

int arkRootCheck3(void* arkode_mem)
{
  int i, retval, ier;
  ARKodeMem ark_mem;
  ARKodeRootMem rootmem;
  if (arkode_mem == NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode",
                    "arkRootCheck3", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem) arkode_mem;
  rootmem = ark_mem->root_mem;

  /* Set thi = tn or tout, whichever comes first; set y = y(thi). */
  if (rootmem->taskc == ARK_ONE_STEP) {
    rootmem->thi = ark_mem->tcur;
    N_VScale(ONE, ark_mem->yn, ark_mem->ycur);
  }
  if (rootmem->taskc == ARK_NORMAL) {
    if ( (rootmem->toutc - ark_mem->tcur)*ark_mem->h >= ZERO) {
      rootmem->thi = ark_mem->tcur;
      N_VScale(ONE, ark_mem->yn, ark_mem->ycur);
    } else {
      rootmem->thi = rootmem->toutc;
      (void) arkGetDky(ark_mem, rootmem->thi, 0, ark_mem->ycur);
    }
  }

  /* Set rootmem->ghi = g(thi) and call arkRootfind to search (tlo,thi) for roots. */
  retval = rootmem->gfun(rootmem->thi, ark_mem->ycur,
                         rootmem->ghi, rootmem->root_data);
  rootmem->nge++;
  if (retval != 0) return(ARK_RTFUNC_FAIL);

  rootmem->ttol = (SUNRabs(ark_mem->tcur) +
                   SUNRabs(ark_mem->h))*ark_mem->uround*HUND;
  ier = arkRootfind(ark_mem);
  if (ier == ARK_RTFUNC_FAIL) return(ARK_RTFUNC_FAIL);
  for(i=0; i<rootmem->nrtfn; i++) {
    if (!rootmem->gactive[i] && rootmem->grout[i] != ZERO)
      rootmem->gactive[i] = SUNTRUE;
  }
  rootmem->tlo = rootmem->trout;
  for (i = 0; i < rootmem->nrtfn; i++)
    rootmem->glo[i] = rootmem->grout[i];

  /* If no root found, return ARK_SUCCESS. */
  if (ier == ARK_SUCCESS) return(ARK_SUCCESS);

  /* If a root was found, interpolate to get y(trout) and return.  */
  (void) arkGetDky(ark_mem, rootmem->trout, 0, ark_mem->ycur);
  return(RTFOUND);
}